

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O2

QList<int> * __thiscall
QPlatformPrintDevice::supportedResolutions
          (QList<int> *__return_storage_ptr__,QPlatformPrintDevice *this)

{
  if (this->m_haveResolutions == false) {
    (*this->_vptr_QPlatformPrintDevice[0x27])(this);
  }
  QArrayDataPointer<int>::QArrayDataPointer(&__return_storage_ptr__->d,&(this->m_resolutions).d);
  return __return_storage_ptr__;
}

Assistant:

QList<int> QPlatformPrintDevice::supportedResolutions() const
{
    if (!m_haveResolutions)
        loadResolutions();
    return m_resolutions;
}